

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O1

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  jpeg_error_mgr *pjVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uchar *st;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar2[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if ((pjVar2[1].insufficient_data != -1) && (iVar11 = cinfo->Ss, iVar11 <= cinfo->Se)) {
    paJVar3 = *MCU_data;
    lVar8 = (long)cinfo->cur_comp_info[0]->ac_tbl_no;
    do {
      lVar9 = *(long *)(&pjVar2[8].insufficient_data + lVar8 * 2);
      lVar14 = (long)(iVar11 * 3 + -3);
      iVar5 = arith_decode(cinfo,(uchar *)(lVar9 + lVar14));
      if (iVar5 != 0) {
        return 1;
      }
      st = (uchar *)(lVar14 + lVar9 + 2);
      lVar9 = 0;
      while (iVar5 = arith_decode(cinfo,st + -1), iVar5 == 0) {
        st = st + 3;
        lVar9 = lVar9 + 1;
        if (cinfo->Se <= iVar11 + -1 + (int)lVar9) goto LAB_0012b6a5;
      }
      iVar5 = arith_decode(cinfo,(uchar *)(pjVar2 + 0xe));
      iVar6 = arith_decode(cinfo,st);
      iVar12 = iVar11 + (int)lVar9;
      if (iVar6 == 0) {
        uVar13 = 0;
      }
      else {
        iVar6 = arith_decode(cinfo,st);
        if (iVar6 == 0) {
          uVar13 = 1;
        }
        else {
          lVar14 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[lVar8] < iVar12) {
            lVar14 = 0xd9;
          }
          st = (uchar *)(lVar14 + *(long *)(&pjVar2[8].insufficient_data + lVar8 * 2));
          iVar6 = arith_decode(cinfo,st);
          uVar13 = 2;
          while (iVar6 != 0) {
            uVar13 = uVar13 * 2;
            if (uVar13 == 0x8000) {
LAB_0012b6a5:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x7e;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,-1);
              pjVar2[1].insufficient_data = -1;
              return 1;
            }
            st = st + 1;
            iVar6 = arith_decode(cinfo,st);
          }
        }
      }
      uVar10 = uVar13;
      if (1 < uVar13) {
        do {
          uVar13 = (int)uVar13 >> 1;
          uVar7 = arith_decode(cinfo,st + 0xe);
          if (uVar7 != 0) {
            uVar7 = uVar13;
          }
          uVar10 = uVar10 | uVar7;
        } while (1 < uVar13);
      }
      uVar13 = ~uVar10;
      if (iVar5 == 0) {
        uVar13 = uVar10 + 1;
      }
      (*paJVar3)[jpeg_natural_order[iVar11 + lVar9]] = (JCOEF)(uVar13 << ((byte)cinfo->Al & 0x1f));
      iVar11 = iVar11 + (int)lVar9 + 1;
    } while (iVar12 < cinfo->Se);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Se = cinfo->Se;
  int Al = cinfo->Al;
  register int s, k, r;
  unsigned int EOBRUN;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl *tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;     /* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)             /* if it's a band of zeroes... */
      EOBRUN--;                 /* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
        HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
        r = s >> 4;
        s &= 15;
        if (s) {
          k += r;
          CHECK_BIT_BUFFER(br_state, s, return FALSE);
          r = GET_BITS(s);
          s = HUFF_EXTEND(r, s);
          /* Scale and output coefficient in natural (dezigzagged) order */
          (*block)[jpeg_natural_order[k]] = (JCOEF)LEFT_SHIFT(s, Al);
        } else {
          if (r == 15) {        /* ZRL */
            k += 15;            /* skip 15 zeroes in band */
          } else {              /* EOBr, run length is 2^r + appended bits */
            EOBRUN = 1 << r;
            if (r) {            /* EOBr, r > 0 */
              CHECK_BIT_BUFFER(br_state, r, return FALSE);
              r = GET_BITS(r);
              EOBRUN += r;
            }
            EOBRUN--;           /* this band is processed at this moment */
            break;              /* force end-of-band */
          }
        }
      }

      BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;     /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}